

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::GetTargetDirectDepends
          (cmComputeTargetDepends *this,cmGeneratorTarget *t,cmTargetDependSet *deps)

{
  const_iterator this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference this_01;
  reference ppcVar4;
  pointer this_02;
  pointer this_03;
  pair<std::_Rb_tree_const_iterator<cmTargetDepend>,_bool> pVar5;
  cmTargetDepend local_90;
  _Base_ptr local_80;
  undefined1 local_78;
  _Rb_tree_const_iterator<cmTargetDepend> local_70;
  iterator di;
  cmGeneratorTarget *dep;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_58;
  const_iterator ni;
  EdgeList *nl;
  iterator iStack_40;
  int i;
  _Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_> local_28;
  const_iterator tii;
  cmTargetDependSet *deps_local;
  cmGeneratorTarget *t_local;
  cmComputeTargetDepends *this_local;
  
  tii._M_node = (_Base_ptr)deps;
  deps_local = (cmTargetDependSet *)t;
  t_local = (cmGeneratorTarget *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
       ::find(&this->TargetIndex,(key_type *)&deps_local);
  std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
  _Rb_tree_const_iterator(&local_28,&local_30);
  iStack_40 = std::
              map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
              ::end(&this->TargetIndex);
  std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
  _Rb_tree_const_iterator(&local_38,&stack0xffffffffffffffc0);
  bVar1 = std::operator!=(&local_28,&local_38);
  if (!bVar1) {
    __assert_fail("tii != this->TargetIndex.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmComputeTargetDepends.cxx"
                  ,0x92,
                  "void cmComputeTargetDepends::GetTargetDirectDepends(const cmGeneratorTarget *, cmTargetDependSet &)"
                 );
  }
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::operator->
                     (&local_28);
  ni._M_current =
       (cmGraphEdge *)
       std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                 (&(this->FinalGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                  (long)ppVar3->second);
  local_58._M_current =
       (cmGraphEdge *)
       std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                 ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ni._M_current);
  while( true ) {
    dep = (cmGeneratorTarget *)
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end
                    ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ni._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                        *)&dep);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator*(&local_58);
    iVar2 = cmGraphEdge::operator_cast_to_int(this_01);
    ppcVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(long)iVar2);
    this_00 = tii;
    di._M_node = (_Base_ptr)*ppcVar4;
    cmTargetDepend::cmTargetDepend(&local_90,(cmGeneratorTarget *)di._M_node);
    pVar5 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
            insert((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                    *)this_00._M_node,&local_90);
    local_80 = (_Base_ptr)pVar5.first._M_node;
    local_78 = pVar5.second;
    local_70._M_node = local_80;
    this_02 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator->(&local_70);
    this_03 = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator->(&local_58);
    bVar1 = cmGraphEdge::IsStrong(this_03);
    cmTargetDepend::SetType(this_02,bVar1);
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::GetTargetDirectDepends(cmGeneratorTarget const* t,
                                                    cmTargetDependSet& deps)
{
  // Lookup the index for this target.  All targets should be known by
  // this point.
  std::map<cmGeneratorTarget const*, int>::const_iterator tii =
    this->TargetIndex.find(t);
  assert(tii != this->TargetIndex.end());
  int i = tii->second;

  // Get its final dependencies.
  EdgeList const& nl = this->FinalGraph[i];
  for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
    cmGeneratorTarget const* dep = this->Targets[*ni];
    cmTargetDependSet::iterator di = deps.insert(dep).first;
    di->SetType(ni->IsStrong());
  }
}